

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_image_t *poVar1;
  OPJ_BOOL OVar2;
  char *fmt;
  uint p_nb_bytes;
  opj_tcp_t *poVar3;
  OPJ_UINT32 l_comp_no;
  OPJ_UINT32 local_40;
  uint local_3c;
  opj_event_mgr_t *local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                  ,0xb88,
                  "OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k != (opj_j2k_t *)0x0) {
    if (p_manager == (opj_event_mgr_t *)0x0) {
      __assert_fail("p_manager != 00",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                    ,0xb8a,
                    "OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                   );
    }
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      poVar3 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      poVar3 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    poVar1 = p_j2k->m_private_image;
    p_nb_bytes = 2 - (poVar1->numcomps < 0x101);
    if (p_nb_bytes < p_header_size) {
      local_40 = ~p_nb_bytes + p_header_size;
      local_38 = p_manager;
      opj_read_bytes_LE(p_header_data,&local_3c,p_nb_bytes);
      if (local_3c < poVar1->numcomps) {
        opj_read_bytes_LE(p_header_data + p_nb_bytes,&poVar3->tccps[local_3c].csty,1);
        p_manager = local_38;
        OVar2 = opj_j2k_read_SPCod_SPCoc
                          (p_j2k,local_3c,p_header_data + (ulong)p_nb_bytes + 1,&local_40,local_38);
        if ((OVar2 != 0) && (local_40 == 0)) {
          return 1;
        }
        fmt = "Error reading COC marker\n";
      }
      else {
        fmt = "Error reading COC marker (bad number of components)\n";
        p_manager = local_38;
      }
    }
    else {
      fmt = "Error reading COC marker\n";
    }
    opj_event_msg(p_manager,1,fmt);
    return 0;
  }
  __assert_fail("p_j2k != 00",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/j2k.c"
                ,0xb89,
                "OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)")
  ;
}

Assistant:

static OPJ_BOOL opj_j2k_read_coc(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    opj_cp_t *l_cp = NULL;
    opj_tcp_t *l_tcp = NULL;
    opj_image_t *l_image = NULL;
    OPJ_UINT32 l_comp_room;
    OPJ_UINT32 l_comp_no;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);
    assert(p_manager != 00);

    l_cp = &(p_j2k->m_cp);
    l_tcp = (p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH)
            ?
            &l_cp->tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;
    l_image = p_j2k->m_private_image;

    l_comp_room = l_image->numcomps <= 256 ? 1 : 2;

    /* make sure room is sufficient*/
    if (p_header_size < l_comp_room + 1) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COC marker\n");
        return OPJ_FALSE;
    }
    p_header_size -= l_comp_room + 1;

    opj_read_bytes(p_header_data, &l_comp_no,
                   l_comp_room);                 /* Ccoc */
    p_header_data += l_comp_room;
    if (l_comp_no >= l_image->numcomps) {
        opj_event_msg(p_manager, EVT_ERROR,
                      "Error reading COC marker (bad number of components)\n");
        return OPJ_FALSE;
    }

    opj_read_bytes(p_header_data, &l_tcp->tccps[l_comp_no].csty,
                   1);                  /* Scoc */
    ++p_header_data ;

    if (! opj_j2k_read_SPCod_SPCoc(p_j2k, l_comp_no, p_header_data, &p_header_size,
                                   p_manager)) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COC marker\n");
        return OPJ_FALSE;
    }

    if (p_header_size != 0) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading COC marker\n");
        return OPJ_FALSE;
    }
    return OPJ_TRUE;
}